

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O1

JavascriptGeneratorFunction *
Js::JavascriptGeneratorFunction::OP_NewScGenFuncHomeObj
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,Var homeObj)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  JavascriptGeneratorFunction *pJVar6;
  
  if (homeObj == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x5d,"(homeObj != nullptr)","homeObj != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = FunctionProxy::GetScriptContext((infoRef->ptr->functionBodyImpl).ptr);
  pTVar1 = pSVar5->threadContext;
  bVar3 = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  pJVar6 = OP_NewScGenFunc(environment,infoRef);
  (*(pJVar6->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x74])(pJVar6,homeObj);
  pTVar1->noJsReentrancy = bVar3;
  return pJVar6;
}

Assistant:

JavascriptGeneratorFunction * JavascriptGeneratorFunction::OP_NewScGenFuncHomeObj(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, Var homeObj)
    {
        Assert(homeObj != nullptr);
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScGenFuncHomeObj, reentrancylock, (*infoRef)->GetFunctionProxy()->GetScriptContext()->GetThreadContext());

        JavascriptGeneratorFunction* genFunc = JavascriptGeneratorFunction::OP_NewScGenFunc(environment, infoRef);

        genFunc->SetHomeObj(homeObj);

        return genFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScGenFuncHomeObj);
    }